

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

string * __thiscall Tokenizer::readName_abi_cxx11_(string *__return_storage_ptr__,Tokenizer *this)

{
  ifstream *piVar1;
  int iVar2;
  long *plVar3;
  char c;
  char local_29;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    plVar3 = (long *)std::istream::get((char *)this->inStream);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    iVar2 = isalnum((int)local_29);
    if (iVar2 == 0) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  piVar1 = this->inStream;
  if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
    std::istream::putback((char)piVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::readName() {
    // This function is called when it is known that
    // the first character in input is an alphabetic character.
    // The function reads and returns all characters of the name.

    std::string name;
    char c;
    while( inStream.get(c) && isalnum(c) ) {
        name += c;
    }
    if(inStream.good())  // In the loop, we have read one char too many.
        inStream.putback(c);
    return name;
}